

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

OrderedPortConnectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::OrderedPortConnectionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::PropertyExprSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          PropertyExprSyntax *args_1)

{
  OrderedPortConnectionSyntax *this_00;
  
  this_00 = (OrderedPortConnectionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((OrderedPortConnectionSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (OrderedPortConnectionSyntax *)allocateSlow(this,0x48,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  slang::syntax::OrderedPortConnectionSyntax::OrderedPortConnectionSyntax(this_00,args,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }